

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O2

void BQMTester<cimod::Dict>::test_DenseBQMFunctionTest_change_vartype(void)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  AssertHelper local_328;
  AssertionResult gtest_ar_14;
  AssertHelper local_310;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict> bqm3;
  Linear<unsigned_int,_double> lin;
  double offset;
  BQM<uint32_t,_double,_cimod::Dict> bqm;
  Linear<unsigned_int,_double> lin2;
  Quadratic<unsigned_int,_double> quad2;
  Quadratic<unsigned_int,_double> quad;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict> bqm2;
  
  bqm.m_linear._M_h._M_rehash_policy._M_max_load_factor = 2.8026e-45;
  bqm.m_linear._M_h._M_rehash_policy._4_4_ = 0;
  bqm.m_linear._M_h._M_rehash_policy._M_next_resize = 0x3fe0000000000000;
  bqm.m_linear._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x1;
  bqm.m_linear._M_h._M_element_count = 0xbff0000000000000;
  bqm.m_linear._M_h._M_buckets = (__buckets_ptr)0x0;
  bqm.m_linear._M_h._M_bucket_count = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&linear,&bqm,&bqm.m_linear._M_h._M_single_bucket,0,&bqm2,&bqm3,&quadratic);
  bqm.m_linear._M_h._M_buckets = (__buckets_ptr)&DAT_100000000;
  bqm.m_linear._M_h._M_bucket_count = 0x3fe0000000000000;
  bqm.m_linear._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&DAT_200000001;
  bqm.m_linear._M_h._M_element_count = 0x3ff8000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&quadratic,&bqm,&bqm.m_linear._M_h._M_rehash_policy,0,&bqm2,&bqm3,&lin);
  offset = 1.4;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::BinaryQuadraticModel
            (&bqm,&linear,&quadratic,&offset,SPIN);
  bqm3.m_linear._M_h._M_buckets._0_4_ = 1;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::change_vartype
            (&bqm2,&bqm,(Vartype *)&bqm3,true);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&lin._M_h,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&bqm);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&quad._M_h,&bqm.m_quadratic._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&lin2._M_h,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&bqm2);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&quad2._M_h,&bqm2.m_quadratic._M_h);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0x1000000;
  pmVar1 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&quad,(key_type *)&gtest_ar_14);
  local_328.data_ = (AssertHelperData *)&DAT_4000000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"quad[std::make_pair(0, 1)]","2.0",pmVar1,(double *)&local_328);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_8_ = &DAT_200000001;
  pmVar1 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&quad,(key_type *)&gtest_ar_14);
  local_328.data_ = (AssertHelperData *)0x4018000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"quad[std::make_pair(1, 2)]","6.0",pmVar1,(double *)&local_328);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x30d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_ = local_328.data_ & 0xffffffff00000000;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin,(key_type *)&local_328);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0x3ff00000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin[0]","1.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x30e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_._0_4_ = 1;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin,(key_type *)&local_328);
  gtest_ar_14._0_8_ = &DAT_c018000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin[1]","-6.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x30f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_._0_4_ = 2;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin,(key_type *)&local_328);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0xc0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin[2]","-2.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x310,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_8_ = &DAT_4007333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"bqm.get_offset()","2.9",&bqm.m_offset,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x311,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_4_ = 1;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)&bqm3,"bqm.get_vartype()","Vartype::BINARY",&bqm.m_vartype,
             (Vartype *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x312,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0x1000000;
  pmVar1 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&quad2,(key_type *)&gtest_ar_14);
  local_328.data_ = (AssertHelperData *)&DAT_4000000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"quad2[std::make_pair(0, 1)]","2.0",pmVar1,(double *)&local_328);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x314,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_8_ = &DAT_200000001;
  pmVar1 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&quad2,(key_type *)&gtest_ar_14);
  local_328.data_ = (AssertHelperData *)0x4018000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"quad2[std::make_pair(1, 2)]","6.0",pmVar1,(double *)&local_328);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x315,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_ = local_328.data_ & 0xffffffff00000000;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin2,(key_type *)&local_328);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0x3ff00000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin2[0]","1.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x316,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_._0_4_ = 1;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin2,(key_type *)&local_328);
  gtest_ar_14._0_8_ = &DAT_c018000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin2[1]","-6.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x317,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  local_328.data_._0_4_ = 2;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&lin2,(key_type *)&local_328);
  gtest_ar_14.success_ = false;
  gtest_ar_14._1_7_ = 0xc0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"lin2[2]","-2.0",pmVar2,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x318,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_8_ = &DAT_4007333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&bqm3,"bqm2.get_offset()","2.9",&bqm2.m_offset,(double *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x319,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_4_ = 1;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)&bqm3,"bqm2.get_vartype()","Vartype::BINARY",&bqm2.m_vartype,
             (Vartype *)&gtest_ar_14);
  if ((char)bqm3.m_linear._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (bqm3.m_linear._M_h._M_bucket_count == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)bqm3.m_linear._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x31a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (gtest_ar_14._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_14._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bqm3.m_linear._M_h._M_bucket_count);
  gtest_ar_14._0_8_ = gtest_ar_14._0_8_ & 0xffffffff00000000;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::change_vartype
            (&bqm3,&bqm,(Vartype *)&gtest_ar_14,false);
  local_328.data_ = (AssertHelperData *)&DAT_4007333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_14,"bqm.get_offset()","2.9",&bqm.m_offset,(double *)&local_328);
  if (gtest_ar_14.success_ == false) {
    testing::Message::Message((Message *)&local_328);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_14.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_14.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x31d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if (local_328.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_328.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_14.message_);
  local_328.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)&gtest_ar_14,"bqm.get_vartype()","Vartype::BINARY",&bqm.m_vartype,
             (Vartype *)&local_328);
  if (gtest_ar_14.success_ == false) {
    testing::Message::Message((Message *)&local_328);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_14.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_14.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x31e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if (local_328.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_328.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_14.message_);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::~BinaryQuadraticModel(&bqm3);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&quad2._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&lin2._M_h);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&quad._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&lin._M_h);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::~BinaryQuadraticModel(&bqm2);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::~BinaryQuadraticModel(&bqm);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&quadratic._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&linear._M_h);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_change_vartype()
    {
        Linear<uint32_t, double> linear{{0, 1.0}, {1, -1.0}, {2, 0.5} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(0, 1), 0.5}, {std::make_pair(1, 2), 1.5} };
        double offset = 1.4;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        auto bqm2 = bqm.change_vartype(Vartype::BINARY, true);
        auto lin = bqm.get_linear();
        auto quad = bqm.get_quadratic();
        auto lin2 = bqm2.get_linear();
        auto quad2 = bqm2.get_quadratic();

        // check quadratic matrix and offset
        EXPECT_EQ(quad[std::make_pair(0, 1)], 2.0);
        EXPECT_EQ(quad[std::make_pair(1, 2)], 6.0);
        EXPECT_EQ(lin[0], 1.0);
        EXPECT_EQ(lin[1], -6.0);
        EXPECT_EQ(lin[2], -2.0);
        EXPECT_EQ(bqm.get_offset(), 2.9);
        EXPECT_EQ(bqm.get_vartype(), Vartype::BINARY);

        EXPECT_EQ(quad2[std::make_pair(0, 1)], 2.0);
        EXPECT_EQ(quad2[std::make_pair(1, 2)], 6.0);
        EXPECT_EQ(lin2[0], 1.0);
        EXPECT_EQ(lin2[1], -6.0);
        EXPECT_EQ(lin2[2], -2.0);
        EXPECT_EQ(bqm2.get_offset(), 2.9);
        EXPECT_EQ(bqm2.get_vartype(), Vartype::BINARY);

        auto bqm3 = bqm.change_vartype(Vartype::SPIN, false);
        EXPECT_EQ(bqm.get_offset(), 2.9);
        EXPECT_EQ(bqm.get_vartype(), Vartype::BINARY);

    }